

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O0

void __thiscall cppforth::Forth::compare(Forth *this)

{
  uint uVar1;
  uint src;
  int iVar2;
  ForthStack<unsigned_int> *this_00;
  uint local_ac;
  undefined1 local_70 [4];
  int result;
  string Word2;
  undefined1 local_40 [8];
  string Word1;
  CAddr caddr1;
  uint length1;
  CAddr caddr2;
  uint length2;
  Forth *this_local;
  
  requireDStackDepth(this,4,"COMPARE");
  this_00 = &this->dStack;
  uVar1 = ForthStack<unsigned_int>::getTop(this_00);
  pop(this);
  src = ForthStack<unsigned_int>::getTop(this_00);
  pop(this);
  Word1.field_2._12_4_ = ForthStack<unsigned_int>::getTop(this_00);
  pop(this);
  Word1.field_2._8_4_ = ForthStack<unsigned_int>::getTop(this_00);
  std::__cxx11::string::string((string *)local_40);
  moveFromDataSpace(this,(string *)local_40,Word1.field_2._8_4_,(ulong)(uint)Word1.field_2._12_4_);
  std::__cxx11::string::string((string *)local_70);
  moveFromDataSpace(this,(string *)local_70,src,(ulong)uVar1);
  iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70);
  if (iVar2 < 0) {
    local_ac = 0xffffffff;
  }
  else {
    local_ac = (uint)(0 < iVar2);
  }
  ForthStack<unsigned_int>::setTop(&this->dStack,local_ac);
  std::__cxx11::string::~string((string *)local_70);
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void compare(){
			REQUIRE_DSTACK_DEPTH(4, "COMPARE");
			auto length2 = dStack.getTop(); pop();
			auto caddr2 = CADDR(dStack.getTop()); pop();
			auto length1 = dStack.getTop(); pop();
			auto caddr1 = CADDR(dStack.getTop()); 
			std::string Word1{};
			moveFromDataSpace(Word1, caddr1, length1);
			std::string Word2{};
			moveFromDataSpace(Word2, caddr2, length2);
			auto result = Word1.compare(Word2);
			dStack.setTop((result < 0) ? -1 : ((result > 0) ? 1 : 0)); 
		}